

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flcFORTRAN_wrap.cxx
# Opt level: O3

void SWIG_store_exception(char *decl,int errcode,char *msg)

{
  flc_ierr = errcode;
  if (SWIG_store_exception::last_exception_msg_abi_cxx11_ == '\0') {
    SWIG_store_exception_cold_1();
  }
  std::__cxx11::string::_M_replace
            (0x105158,0,(char *)SWIG_store_exception::last_exception_msg_abi_cxx11_._M_string_length
             ,0x1030f9);
  std::__cxx11::string::append((char *)&SWIG_store_exception::last_exception_msg_abi_cxx11_);
  std::__cxx11::string::append((char *)&SWIG_store_exception::last_exception_msg_abi_cxx11_);
  std::__cxx11::string::append((char *)&SWIG_store_exception::last_exception_msg_abi_cxx11_);
  swig_last_exception_cstr = SWIG_store_exception::last_exception_msg_abi_cxx11_._M_dataplus._M_p;
  return;
}

Assistant:

SWIGEXPORT void SWIG_store_exception(const char *decl,
                                     int errcode,
                                     const char *msg) {
  ::flc_ierr = errcode;

  static std::string last_exception_msg;
  // Save the message to a std::string first
  last_exception_msg = "In ";
  last_exception_msg += decl;
  last_exception_msg += ": ";
  last_exception_msg += msg;
  swig_last_exception_cstr = last_exception_msg.c_str();
}